

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t * get_copy_of_container(container_t *c,uint8_t *typecode,_Bool copy_on_write)

{
  container_t *pcVar1;
  undefined8 *puVar2;
  undefined7 in_register_00000011;
  uint8_t typecode_00;
  
  typecode_00 = *typecode;
  if ((int)CONCAT71(in_register_00000011,copy_on_write) != 0) {
    if (typecode_00 == '\x04') {
      *(int *)((long)c + 0xc) = *(int *)((long)c + 0xc) + 1;
      puVar2 = (undefined8 *)c;
    }
    else {
      puVar2 = (undefined8 *)malloc(0x10);
      if (puVar2 == (undefined8 *)0x0) {
        puVar2 = (undefined8 *)0x0;
      }
      else {
        *puVar2 = c;
        *(uint8_t *)(puVar2 + 1) = typecode_00;
        *(undefined4 *)((long)puVar2 + 0xc) = 2;
        *typecode = '\x04';
      }
    }
    return puVar2;
  }
  if (typecode_00 == '\x04') {
    typecode_00 = *(uint8_t *)((long)c + 8);
    *typecode = typecode_00;
    if (typecode_00 == '\x04') {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    c = *c;
  }
  pcVar1 = container_clone(c,typecode_00);
  return pcVar1;
}

Assistant:

container_t *get_copy_of_container(
    container_t *c, uint8_t *typecode,
    bool copy_on_write
){
    if (copy_on_write) {
        shared_container_t *shared_container;
        if (*typecode == SHARED_CONTAINER_TYPE) {
            shared_container = CAST_shared(c);
            shared_container->counter += 1;
            return shared_container;
        }
        assert(*typecode != SHARED_CONTAINER_TYPE);

        if ((shared_container = (shared_container_t *)malloc(
                 sizeof(shared_container_t))) == NULL) {
            return NULL;
        }

        shared_container->container = c;
        shared_container->typecode = *typecode;

        shared_container->counter = 2;
        *typecode = SHARED_CONTAINER_TYPE;

        return shared_container;
    }  // copy_on_write
    // otherwise, no copy on write...
    const container_t *actual_container = container_unwrap_shared(c, typecode);
    assert(*typecode != SHARED_CONTAINER_TYPE);
    return container_clone(actual_container, *typecode);
}